

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

LONG PAL_atol(char *szNumber)

{
  long lVar1;
  long lResult;
  char *szNumber_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  lVar1 = atol(szNumber);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return (LONG)lVar1;
}

Assistant:

LONG
__cdecl
PAL_atol(const char *szNumber)
{
    long lResult;

    PERF_ENTRY(atol);
    ENTRY("atol (szNumber=%p (%s))\n",
        szNumber?szNumber:"NULL"
        );

    lResult = atol(szNumber);

    LOGEXIT("atol returning long %ld\n", (LONG)lResult);
    PERF_EXIT(atol);
    /* This explicit cast to LONG is used to silence any potential warnings
        due to implicitly casting the native long lResult to LONG when returning. */
    return (LONG)lResult;

}